

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86Mapping.c
# Opt level: O0

void add_cx(MCInst *MI)

{
  cs_detail *pcVar1;
  uint8_t uVar2;
  x86_reg cx;
  MCInst *MI_local;
  
  if (MI->csh->detail != CS_OPT_OFF) {
    if ((MI->csh->mode & CS_MODE_16) == CS_MODE_ARM) {
      if ((MI->csh->mode & CS_MODE_32) == CS_MODE_ARM) {
        uVar2 = '&';
      }
      else {
        uVar2 = '\x16';
      }
    }
    else {
      uVar2 = '\f';
    }
    MI->flat_insn->detail->regs_read[MI->flat_insn->detail->regs_read_count] = uVar2;
    pcVar1 = MI->flat_insn->detail;
    pcVar1->regs_read_count = pcVar1->regs_read_count + '\x01';
    MI->flat_insn->detail->regs_write[MI->flat_insn->detail->regs_write_count] = uVar2;
    pcVar1 = MI->flat_insn->detail;
    pcVar1->regs_write_count = pcVar1->regs_write_count + '\x01';
  }
  return;
}

Assistant:

static void add_cx(MCInst *MI)
{
	if (MI->csh->detail) {
		x86_reg cx;

		if (MI->csh->mode & CS_MODE_16)
			cx = X86_REG_CX;
		else if (MI->csh->mode & CS_MODE_32)
			cx = X86_REG_ECX;
		else	// 64-bit
			cx = X86_REG_RCX;

		MI->flat_insn->detail->regs_read[MI->flat_insn->detail->regs_read_count] = cx;
		MI->flat_insn->detail->regs_read_count++;

		MI->flat_insn->detail->regs_write[MI->flat_insn->detail->regs_write_count] = cx;
		MI->flat_insn->detail->regs_write_count++;
	}
}